

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void pugi::impl::anon_unknown_0::recursive_copy_skip(xml_node *dest,xml_node *source,xml_node *skip)

{
  bool bVar1;
  xml_node_type xVar2;
  xml_node_type xVar3;
  unspecified_bool_type p_Var4;
  char_t *pcVar5;
  unspecified_bool_type p_Var6;
  xml_attribute local_60;
  xml_attribute local_58;
  xml_attribute a_1;
  xml_node local_48;
  xml_node cc;
  xml_node c;
  xml_attribute local_30;
  xml_attribute local_28;
  xml_attribute a;
  xml_node *skip_local;
  xml_node *source_local;
  xml_node *dest_local;
  
  a._attr = (xml_attribute_struct *)skip;
  xVar2 = xml_node::type(dest);
  xVar3 = xml_node::type(source);
  if (xVar2 != xVar3) {
    __assert_fail("dest.type() == source.type()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/elmindreda[P]greg/deps/pugixml.cpp"
                  ,0xca0,
                  "void pugi::impl::(anonymous namespace)::recursive_copy_skip(xml_node &, const xml_node &, const xml_node &)"
                 );
  }
  xVar2 = xml_node::type(source);
  switch(xVar2) {
  case node_element:
    pcVar5 = xml_node::name(source);
    xml_node::set_name(dest,pcVar5);
    local_28 = xml_node::first_attribute(source);
    while (p_Var6 = xml_attribute::operator_cast_to_function_pointer(&local_28),
          p_Var6 != (unspecified_bool_type)0x0) {
      pcVar5 = xml_attribute::name(&local_28);
      local_30 = xml_node::append_attribute(dest,pcVar5);
      pcVar5 = xml_attribute::value(&local_28);
      xml_attribute::set_value(&local_30,pcVar5);
      local_28 = xml_attribute::next_attribute(&local_28);
    }
    cc = xml_node::first_child(source);
    while (p_Var4 = xml_node::operator_cast_to_function_pointer(&cc),
          p_Var4 != (unspecified_bool_type)0x0) {
      bVar1 = xml_node::operator==(&cc,(xml_node *)a._attr);
      if (!bVar1) {
        xVar2 = xml_node::type(&cc);
        local_48 = xml_node::append_child(dest,xVar2);
        p_Var4 = xml_node::operator_cast_to_function_pointer(&local_48);
        if (p_Var4 == (unspecified_bool_type)0x0) {
          __assert_fail("cc",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/elmindreda[P]greg/deps/pugixml.cpp"
                        ,0xcb0,
                        "void pugi::impl::(anonymous namespace)::recursive_copy_skip(xml_node &, const xml_node &, const xml_node &)"
                       );
        }
        recursive_copy_skip(&local_48,&cc,(xml_node *)a._attr);
      }
      a_1._attr = (xml_attribute_struct *)xml_node::next_sibling(&cc);
      cc = (xml_node)a_1._attr;
    }
    break;
  case node_pcdata:
  case node_cdata:
  case node_comment:
  case node_doctype:
    pcVar5 = xml_node::value(source);
    xml_node::set_value(dest,pcVar5);
    break;
  case node_pi:
    pcVar5 = xml_node::name(source);
    xml_node::set_name(dest,pcVar5);
    pcVar5 = xml_node::value(source);
    xml_node::set_value(dest,pcVar5);
    break;
  case node_declaration:
    pcVar5 = xml_node::name(source);
    xml_node::set_name(dest,pcVar5);
    local_58 = xml_node::first_attribute(source);
    while (p_Var6 = xml_attribute::operator_cast_to_function_pointer(&local_58),
          p_Var6 != (unspecified_bool_type)0x0) {
      pcVar5 = xml_attribute::name(&local_58);
      local_60 = xml_node::append_attribute(dest,pcVar5);
      pcVar5 = xml_attribute::value(&local_58);
      xml_attribute::set_value(&local_60,pcVar5);
      local_58 = xml_attribute::next_attribute(&local_58);
    }
    break;
  default:
    __assert_fail("!\"Invalid node type\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/elmindreda[P]greg/deps/pugixml.cpp"
                  ,0xccf,
                  "void pugi::impl::(anonymous namespace)::recursive_copy_skip(xml_node &, const xml_node &, const xml_node &)"
                 );
  }
  return;
}

Assistant:

PUGI__FN void recursive_copy_skip(xml_node& dest, const xml_node& source, const xml_node& skip)
	{
		assert(dest.type() == source.type());

		switch (source.type())
		{
		case node_element:
		{
			dest.set_name(source.name());

			for (xml_attribute a = source.first_attribute(); a; a = a.next_attribute())
				dest.append_attribute(a.name()).set_value(a.value());

			for (xml_node c = source.first_child(); c; c = c.next_sibling())
			{
				if (c == skip) continue;

				xml_node cc = dest.append_child(c.type());
				assert(cc);

				recursive_copy_skip(cc, c, skip);
			}

			break;
		}

		case node_pcdata:
		case node_cdata:
		case node_comment:
		case node_doctype:
			dest.set_value(source.value());
			break;

		case node_pi:
			dest.set_name(source.name());
			dest.set_value(source.value());
			break;

		case node_declaration:
		{
			dest.set_name(source.name());

			for (xml_attribute a = source.first_attribute(); a; a = a.next_attribute())
				dest.append_attribute(a.name()).set_value(a.value());

			break;
		}

		default:
			assert(!"Invalid node type");
		}
	}